

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<std::__cxx11::string>::internalSetData<std::vector<double,std::allocator<double>>>
          (Parameter<std::__cxx11::string> *this,vector<double,_std::allocator<double>_> *data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_20,data);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
  std::__cxx11::string::~string((string *)&local_40);
  return false;
}

Assistant:

static bool convert(RepType v, RepType& r) {
    r = v;
    return true;
  }